

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManCountMark1Dfs_rec(Gia_Man_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  uVar2 = 0;
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pGVar4 = Gia_ManObj(p,iObj);
    uVar2 = (uint)*(undefined8 *)pGVar4;
    if ((int)uVar2 < 0 || (~uVar2 & 0x1fffffff) == 0) {
      uVar2 = (uint)((ulong)*(undefined8 *)pGVar4 >> 0x3e) & 1;
    }
    else {
      iVar1 = Gia_ManCountMark1Dfs_rec(p,iObj - (uVar2 & 0x1fffffff));
      iVar3 = Gia_ManCountMark1Dfs_rec(p,iObj - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
      uVar2 = iVar3 + iVar1 + (uint)((*(ulong *)pGVar4 >> 0x3e & 1) != 0);
    }
  }
  return uVar2;
}

Assistant:

int Gia_ManCountMark1Dfs_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( !Gia_ObjIsAnd(pObj) )
        return pObj->fMark1;
    return Gia_ManCountMark1Dfs_rec( p, Gia_ObjFaninId0(pObj, iObj) ) + 
           Gia_ManCountMark1Dfs_rec( p, Gia_ObjFaninId1(pObj, iObj) ) + pObj->fMark1;
}